

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap)

{
  ExprList *pEVar1;
  Table *pTab_00;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Select *pSVar9;
  CollSeq *pCVar10;
  ulong uVar11;
  int *in_RCX;
  uint in_EDX;
  Expr *in_RSI;
  Parse *in_RDI;
  long in_R8;
  int n;
  int i_2;
  int rMayHaveNull;
  u32 savedNQueryLoop;
  int iAddr_1;
  int j;
  CollSeq *pReq;
  Expr *pRhs;
  Expr *pLhs_1;
  Bitmask mCol;
  Bitmask colUsed;
  char cmpaff;
  char idxaff;
  int iCol;
  Expr *pLhs;
  int i_1;
  int affinity_ok;
  Index *pIdx;
  int iAddr;
  int nExpr;
  ExprList *pEList_1;
  i16 iDb;
  Table *pTab;
  sqlite3 *db;
  ExprList *pEList;
  int i;
  Vdbe *v;
  int mustBeUnique;
  int iTab;
  int eType;
  Select *p;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  uint in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  u32 uVar12;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar13;
  undefined8 in_stack_ffffffffffffff38;
  Parse *in_stack_ffffffffffffff40;
  Expr *pEVar14;
  ulong local_a8;
  int local_90;
  Index *local_88;
  int local_4c;
  int local_34;
  int *local_20;
  
  local_34 = 0;
  iVar8 = in_RDI->nTab;
  in_RDI->nTab = iVar8 + 1;
  sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_20 = in_RCX;
  if ((in_RCX != (int *)0x0) && ((in_RSI->flags & 0x800) != 0)) {
    pEVar1 = ((in_RSI->x).pSelect)->pEList;
    local_4c = 0;
    while ((local_4c < pEVar1->nExpr &&
           (iVar6 = sqlite3ExprCanBeNull(pEVar1->a[local_4c].pExpr), iVar6 == 0))) {
      local_4c = local_4c + 1;
    }
    if (local_4c == pEVar1->nExpr) {
      local_20 = (int *)0x0;
    }
  }
  if ((in_RDI->nErr == 0) && (pSVar9 = isCandidateForInOpt(in_RSI), pSVar9 != (Select *)0x0)) {
    pEVar1 = pSVar9->pEList;
    iVar6 = pEVar1->nExpr;
    pTab_00 = pSVar9->pSrc->a[0].pTab;
    sqlite3SchemaToIndex(in_RDI->db,pTab_00->pSchema);
    sqlite3CodeVerifySchema
              ((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c);
    sqlite3TableLock(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                     (int)in_stack_ffffffffffffff38,(u8)((uint)in_stack_ffffffffffffff34 >> 0x18),
                     (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if ((iVar6 == 1) && ((pEVar1->a[0].pExpr)->iColumn < 0)) {
      sqlite3VdbeAddOp0((Vdbe *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
      sqlite3OpenTable((Parse *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                       (Table *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      local_34 = 1;
      sqlite3VdbeExplain(in_RDI,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab_00->zName
                        );
      sqlite3VdbeJumpHere((Vdbe *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff0c);
    }
    else {
      bVar2 = true;
      local_90 = 0;
      while( true ) {
        uVar3 = in_stack_ffffffffffffff1c & 0xffffff;
        if (local_90 < iVar6) {
          uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff1c);
        }
        in_stack_ffffffffffffff1c = uVar3;
        if ((char)(in_stack_ffffffffffffff1c >> 0x18) == '\0') break;
        sqlite3VectorFieldSubexpr
                  ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
        bVar4 = sqlite3TableColumnAffinity(pTab_00,(int)(pEVar1->a[local_90].pExpr)->iColumn);
        bVar5 = sqlite3CompareAffinity
                          ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           '\0');
        in_stack_ffffffffffffff18 = (uint)bVar5;
        if ((in_stack_ffffffffffffff18 != 0x41) && (in_stack_ffffffffffffff18 != 0x42)) {
          bVar2 = 0x42 < bVar4;
        }
        local_90 = local_90 + 1;
      }
      if (bVar2) {
        for (local_88 = pTab_00->pIndex;
            in_stack_ffffffffffffff17 = local_88 != (Index *)0x0 && local_34 == 0,
            local_88 != (Index *)0x0 && local_34 == 0; local_88 = local_88->pNext) {
          if (((iVar6 <= (int)(uint)local_88->nColumn) && (local_88->nColumn < 0x3f)) &&
             (((in_EDX & 4) == 0 ||
              (((int)(uint)local_88->nKeyCol <= iVar6 &&
               (((int)(uint)local_88->nColumn <= iVar6 || (local_88->onError != '\0')))))))) {
            local_a8 = 0;
            for (local_90 = 0; local_90 < iVar6; local_90 = local_90 + 1) {
              sqlite3VectorFieldSubexpr
                        ((Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
              pEVar14 = pEVar1->a[local_90].pExpr;
              pCVar10 = sqlite3BinaryCompareCollSeq
                                  ((Parse *)CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20),
                                   (Expr *)CONCAT44(in_stack_ffffffffffffff1c,
                                                    in_stack_ffffffffffffff18),
                                   (Expr *)CONCAT17(in_stack_ffffffffffffff17,
                                                    in_stack_ffffffffffffff10));
              iVar13 = 0;
              while ((iVar13 < iVar6 &&
                     ((local_88->aiColumn[iVar13] != pEVar14->iColumn ||
                      ((pCVar10 != (CollSeq *)0x0 &&
                       (iVar7 = sqlite3StrICmp(pCVar10->zName,local_88->azColl[iVar13]), iVar7 != 0)
                       )))))) {
                iVar13 = iVar13 + 1;
              }
              if ((iVar13 == iVar6) ||
                 (uVar11 = 1L << ((byte)iVar13 & 0x3f), (uVar11 & local_a8) != 0)) break;
              local_a8 = uVar11 | local_a8;
              if (in_R8 != 0) {
                *(int *)(in_R8 + (long)local_90 * 4) = iVar13;
              }
            }
            if (local_a8 == (1L << ((byte)iVar6 & 0x3f)) - 1U) {
              sqlite3VdbeAddOp0((Vdbe *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10
                                                ),in_stack_ffffffffffffff0c);
              sqlite3VdbeExplain(in_RDI,'\0',"USING INDEX %s FOR IN-OPERATOR",local_88->zName);
              sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                ),in_stack_ffffffffffffff24,
                                in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                in_stack_ffffffffffffff18);
              sqlite3VdbeSetP4KeyInfo
                        ((Parse *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (Index *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
              local_34 = *local_88->aSortOrder + 3;
              if (local_20 != (int *)0x0) {
                iVar13 = in_RDI->nMem + 1;
                in_RDI->nMem = iVar13;
                *local_20 = iVar13;
                if (iVar6 == 1) {
                  sqlite3SetHasNullFlag
                            ((Vdbe *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
                }
              }
              sqlite3VdbeJumpHere((Vdbe *)CONCAT17(in_stack_ffffffffffffff17,
                                                   in_stack_ffffffffffffff10),
                                  in_stack_ffffffffffffff0c);
            }
          }
        }
      }
    }
  }
  if ((((local_34 == 0) && ((in_EDX & 1) != 0)) && ((in_RSI->flags & 0x800) == 0)) &&
     ((iVar6 = sqlite3InRhsIsConstant
                         ((Expr *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)),
      iVar6 == 0 || (((in_RSI->x).pList)->nExpr < 3)))) {
    local_34 = 5;
  }
  if (local_34 == 0) {
    uVar12 = in_RDI->nQueryLoop;
    local_34 = 2;
    if ((in_EDX & 4) == 0) {
      if (local_20 != (int *)0x0) {
        iVar8 = in_RDI->nMem + 1;
        in_RDI->nMem = iVar8;
        *local_20 = iVar8;
      }
    }
    else {
      in_RDI->nQueryLoop = 0;
      if ((in_RSI->pLeft->iColumn < 0) && ((in_RSI->flags & 0x800) == 0)) {
        local_34 = 1;
      }
    }
    sqlite3CodeSubselect((Parse *)pRhs,(Expr *)pReq,j,iAddr_1);
    in_RDI->nQueryLoop = uVar12;
  }
  else {
    in_RSI->iTable = iVar8;
  }
  if (((in_R8 != 0) && (local_34 != 3)) && (local_34 != 4)) {
    iVar8 = sqlite3ExprVectorSize(in_RSI->pLeft);
    for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
      *(int *)(in_R8 + (long)iVar6 * 4) = iVar6;
    }
  }
  return local_34;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap                 /* Mapping from Index fields to RHS fields */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  return eType;
}